

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O0

void amrex::UtilCreateDirectoryDestructive(string *path,bool callbarrier)

{
  bool bVar1;
  int iVar2;
  byte in_SIL;
  string *in_stack_000005e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe08;
  allocator *paVar3;
  Print *in_stack_fffffffffffffe10;
  allocator local_1c9;
  ostream *in_stack_fffffffffffffe38;
  Print *in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  Print *in_stack_fffffffffffffe80;
  
  bVar1 = ParallelContext::IOProcessorSub();
  if (bVar1) {
    bVar1 = FileExists((string *)0x11e77f6);
    if (bVar1) {
      iVar2 = Verbose();
      if (1 < iVar2) {
        OutStream();
        Print::Print(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        Print::operator<<(in_stack_fffffffffffffe10,(char (*) [48])in_stack_fffffffffffffe08);
        Print::operator<<(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
        in_stack_fffffffffffffe10 =
             Print::operator<<(in_stack_fffffffffffffe10,(char (*) [32])in_stack_fffffffffffffe08);
        Print::operator<<(in_stack_fffffffffffffe10,
                          (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                           *)in_stack_fffffffffffffe08);
        Print::~Print(in_stack_fffffffffffffe80);
      }
      FileSystem::RemoveAll(in_stack_000005e8);
    }
    bVar1 = UtilCreateDirectory((string *)in_stack_fffffffffffffe10,
                                (mode_t)((ulong)in_stack_fffffffffffffe08 >> 0x20),
                                SUB81((ulong)in_stack_fffffffffffffe08 >> 0x18,0));
    if (!bVar1) {
      CreateDirectoryFailed((string *)in_stack_fffffffffffffe48);
    }
  }
  if ((in_SIL & 1) != 0) {
    paVar3 = &local_1c9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffe38,"amrex::UtilCreateCleanDirectoryDestructive",
               paVar3);
    ParallelDescriptor::Barrier((string *)&stack0xfffffffffffffe38);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffe38);
    std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  }
  return;
}

Assistant:

void
amrex::UtilCreateDirectoryDestructive(const std::string &path, bool callbarrier)
{
  if(ParallelContext::IOProcessorSub())
  {
    if(amrex::FileExists(path))
    {
      if (amrex::Verbose() > 1) {
          amrex::Print() << "amrex::UtilCreateCleanDirectoryDestructive():  " << path
                         << " exists.  I am destroying it.  " << std::endl;
      }
      FileSystem::RemoveAll(path);
    }
    if( ! amrex::UtilCreateDirectory(path, 0755))
    {
      amrex::CreateDirectoryFailed(path);
    }
  }
  if(callbarrier)
  {
    // Force other processors to wait until directory is built.
    ParallelDescriptor::Barrier("amrex::UtilCreateCleanDirectoryDestructive");
  }
}